

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

Namespace *
flatbuffers::anon_unknown_0::GetNamespace
          (string *qualified_name,
          vector<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_> *namespaces,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*>_>_>
          *namespaces_index)

{
  pointer pcVar1;
  long lVar2;
  mapped_type *__x;
  mapped_type pNVar3;
  string namespace_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lVar2 = std::__cxx11::string::rfind((char)qualified_name,0x2e);
  if (lVar2 == -1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&namespace_name,"",(allocator<char> *)&local_50);
  }
  else {
    pcVar1 = (qualified_name->_M_dataplus)._M_p;
    namespace_name._M_dataplus._M_p = (pointer)&namespace_name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&namespace_name,pcVar1,pcVar1 + lVar2)
    ;
  }
  __x = std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*>_>_>
        ::operator[](namespaces_index,&namespace_name);
  pNVar3 = *__x;
  if (pNVar3 == (mapped_type)0x0) {
    pNVar3 = (mapped_type)operator_new(0x20);
    (pNVar3->components).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pNVar3->from_table = 0;
    (pNVar3->components).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pNVar3->components).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    *__x = pNVar3;
    std::vector<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>::push_back
              (namespaces,__x);
    while( true ) {
      lVar2 = std::__cxx11::string::find((char)qualified_name,0x2e);
      pNVar3 = *__x;
      if (lVar2 == -1) break;
      std::__cxx11::string::substr((ulong)&local_50,(ulong)qualified_name);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pNVar3,
                 &local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  std::__cxx11::string::~string((string *)&namespace_name);
  return pNVar3;
}

Assistant:

static Namespace *GetNamespace(
    const std::string &qualified_name, std::vector<Namespace *> &namespaces,
    std::map<std::string, Namespace *> &namespaces_index) {
  size_t dot = qualified_name.find_last_of('.');
  std::string namespace_name = (dot != std::string::npos)
                                   ? std::string(qualified_name.c_str(), dot)
                                   : "";
  Namespace *&ns = namespaces_index[namespace_name];

  if (!ns) {
    ns = new Namespace();
    namespaces.push_back(ns);

    size_t pos = 0;

    for (;;) {
      dot = qualified_name.find('.', pos);
      if (dot == std::string::npos) { break; }
      ns->components.push_back(qualified_name.substr(pos, dot - pos));
      pos = dot + 1;
    }
  }

  return ns;
}